

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr.h
# Opt level: O2

int32_t * xdr_inline_encode(XDR *xdrs,size_t count)

{
  int32_t *piVar1;
  uint8_t *puVar2;
  
  piVar1 = (int32_t *)xdrs->x_data;
  puVar2 = (uint8_t *)(count + (long)piVar1);
  if ((xdrs->x_v).vio_wrap < puVar2) {
    piVar1 = (int32_t *)0x0;
  }
  else {
    xdrs->x_data = puVar2;
    if ((xdrs->x_v).vio_tail < puVar2) {
      (xdrs->x_v).vio_tail = puVar2;
      *(uint8_t **)((long)xdrs->x_base + 0x10) = puVar2;
      return piVar1;
    }
  }
  return piVar1;
}

Assistant:

static inline int32_t *
xdr_inline_encode(XDR *xdrs, size_t count)
{
	int32_t *buf = (int32_t *)xdrs->x_data;
	uint8_t *future = xdrs->x_data + count;

	if (future <= xdrs->x_v.vio_wrap) {
		xdrs->x_data = future;
		xdr_tail_update(xdrs);
		return (buf);
	}
	return (NULL);
}